

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

fdb_compact_decision
cb_snapshot(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
           uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  int iVar1;
  long in_RDX;
  int in_ESI;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  cb_snapshot_args *args;
  cb_snapshot_args *in_stack_00000218;
  fdb_file_handle *in_stack_00000220;
  int in_stack_00000248;
  int in_stack_0000024c;
  fdb_kvs_handle *in_stack_00000250;
  timeval local_48;
  __suseconds_t local_38;
  long local_18;
  int local_c;
  
  local_38 = __test_interval_ins.tv_usec;
  local_18 = in_RDX;
  local_c = in_ESI;
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  iVar1 = *(int *)(local_38 + 0x10) + -1;
  *(int *)(local_38 + 0x10) = iVar1;
  if (-1 < iVar1) {
    if (local_18 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xfa7);
      cb_snapshot::__test_pass = 0;
      if (local_18 != 0) {
        __assert_fail("!kv_name",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xfa7,
                      "fdb_compact_decision cb_snapshot(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
    }
    if (local_c == 1) {
      _snapshot_check(in_stack_00000250,in_stack_0000024c,in_stack_00000248);
      _snapshot_update_docs(in_stack_00000220,in_stack_00000218);
      _snapshot_check(in_stack_00000250,in_stack_0000024c,in_stack_00000248);
    }
    else {
      _snapshot_check(in_stack_00000250,in_stack_0000024c,in_stack_00000248);
      _snapshot_update_docs(in_stack_00000220,in_stack_00000218);
      _snapshot_check(in_stack_00000250,in_stack_0000024c,in_stack_00000248);
    }
  }
  return 0;
}

Assistant:

static fdb_compact_decision cb_snapshot(fdb_file_handle *fhandle,
        fdb_compaction_status status, const char *kv_name,
        fdb_doc *doc, uint64_t old_offset, uint64_t new_offset,
        void *ctx)
{
    struct cb_snapshot_args *args = (struct cb_snapshot_args *)ctx;
    TEST_INIT();

    if (--args->niterations >= 0) {
        TEST_CHK(!kv_name);
        if (status == FDB_CS_BEGIN) {
            // first verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
            // update half docs
            _snapshot_update_docs(fhandle, args);
            // second verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
        } else { // if (status == FDB_CS_END)
            // first verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
            // update half docs
            _snapshot_update_docs(fhandle, args);
            // second verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
        }
    }
    return 0;
}